

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_usage(string *__return_storage_ptr__,Formatter *this,App *app,string *name)

{
  ostream *poVar1;
  string *delim;
  char *pcVar2;
  char *pcVar3;
  allocator local_319;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positional_names;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> positionals;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> non_pos_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_258;
  string local_238;
  string usage;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  stringstream out;
  ostream local_1a8 [376];
  
  App::get_usage_abi_cxx11_(&usage,app);
  if (usage._M_string_length == 0) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
    ::std::operator<<(local_1a8,'\n');
    if (name->_M_string_length == 0) {
      ::std::__cxx11::string::string((string *)&local_238,"Usage",(allocator *)&groups);
      FormatterBase::get_label((string *)&local_318,&this->super_FormatterBase,&local_238);
      poVar1 = ::std::operator<<(local_1a8,(string *)local_318._M_pod_data);
      ::std::operator<<(poVar1,':');
      ::std::__cxx11::string::~string((string *)local_318._M_pod_data);
      ::std::__cxx11::string::~string((string *)&local_238);
    }
    else {
      ::std::operator<<(local_1a8,(string *)name);
    }
    App::get_groups_abi_cxx11_(&groups,app);
    local_1d8._M_unused._M_object = (void *)0x0;
    local_1d8._8_8_ = 0;
    local_1c0 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11245:26)>
                ::_M_invoke;
    local_1c8 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11245:26)>
                ::_M_manager;
    App::get_options(&non_pos_options,app,(function<bool_(const_CLI::Option_*)> *)&local_1d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
    if (non_pos_options.
        super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        non_pos_options.
        super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar1 = ::std::operator<<(local_1a8," [");
      ::std::__cxx11::string::string((string *)&local_258,"options",(allocator *)&positionals);
      FormatterBase::get_label((string *)&local_318,&this->super_FormatterBase,&local_258);
      poVar1 = ::std::operator<<(poVar1,(string *)local_318._M_pod_data);
      ::std::operator<<(poVar1,"]");
      ::std::__cxx11::string::~string((string *)local_318._M_pod_data);
      ::std::__cxx11::string::~string((string *)&local_258);
    }
    local_1f8._M_unused._M_object = (void *)0x0;
    local_1f8._8_8_ = 0;
    local_1e0 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11250:64)>
                ::_M_invoke;
    local_1e8 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11250:64)>
                ::_M_manager;
    App::get_options(&positionals,app,(function<bool_(const_CLI::Option_*)> *)&local_1f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
    if (positionals.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        positionals.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&positional_names,
               (long)positionals.
                     super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)positionals.
                     super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,
               (allocator_type *)local_318._M_pod_data);
      delim = (string *)this;
      ::std::
      transform<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_3_>
                ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  )positionals.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  )positionals.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )positional_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,(anon_class_8_1_8991fb9c)this);
      poVar1 = ::std::operator<<(local_1a8," ");
      ::std::__cxx11::string::string((string *)&local_278," ",&local_319);
      detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)&local_318,(detail *)&positional_names,&local_278,delim);
      ::std::operator<<(poVar1,(string *)local_318._M_pod_data);
      ::std::__cxx11::string::~string((string *)local_318._M_pod_data);
      ::std::__cxx11::string::~string((string *)&local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&positional_names);
    }
    local_318._M_unused._M_object = (void *)0x0;
    local_318._8_8_ = 0;
    local_300 = std::
                _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11265:16)>
                ::_M_invoke;
    local_308 = std::
                _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11265:16)>
                ::_M_manager;
    App::get_subcommands
              ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)&positional_names,app,
               (function<bool_(const_CLI::App_*)> *)&local_318);
    std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base
              ((_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
               &positional_names);
    std::_Function_base::~_Function_base((_Function_base *)&local_318);
    if (positional_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        positional_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      poVar1 = ::std::operator<<(local_1a8,' ');
      pcVar2 = "[";
      pcVar3 = "";
      if (app->require_subcommand_min_ != 0) {
        pcVar2 = "";
      }
      poVar1 = ::std::operator<<(poVar1,pcVar2);
      if (app->require_subcommand_max_ < 2) {
        pcVar2 = "SUBCOMMAND";
      }
      else {
        pcVar2 = "SUBCOMMANDS";
        if (1 < app->require_subcommand_min_) {
          pcVar2 = "SUBCOMMAND";
        }
      }
      ::std::__cxx11::string::string((string *)&local_298,pcVar2,(allocator *)&positional_names);
      FormatterBase::get_label((string *)&local_318,&this->super_FormatterBase,&local_298);
      poVar1 = ::std::operator<<(poVar1,(string *)local_318._M_pod_data);
      if (app->require_subcommand_min_ == 0) {
        pcVar3 = "]";
      }
      ::std::operator<<(poVar1,pcVar3);
      ::std::__cxx11::string::~string((string *)local_318._M_pod_data);
      ::std::__cxx11::string::~string((string *)&local_298);
    }
    ::std::operator<<(local_1a8,"\n");
    ::std::__cxx11::stringbuf::str();
    std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
              (&positionals.
                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>);
    std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
              (&non_pos_options.
                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&groups);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  }
  else {
    ::std::operator+(__return_storage_ptr__,&usage,"\n");
  }
  ::std::__cxx11::string::~string((string *)&usage);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_usage(const App *app, std::string name) const {
    std::string usage = app->get_usage();
    if(!usage.empty()) {
        // return usage + "\n\n";
        return usage + "\n";
    }

    std::stringstream out;
    out << '\n';

    if(name.empty())
        out << get_label("Usage") << ':';
    else
        out << name;

    std::vector<std::string> groups = app->get_groups();

    // Print an Options badge if any options exist
    std::vector<const Option *> non_pos_options =
        app->get_options([](const Option *opt) { return opt->nonpositional(); });
    if(!non_pos_options.empty())
        out << " [" << get_label("options") << "]";

    // Positionals need to be listed here
    std::vector<const Option *> positionals = app->get_options([](const Option *opt) { return opt->get_positional(); });

    // Print out positionals if any are left
    if(!positionals.empty()) {
        // Convert to help names
        std::vector<std::string> positional_names(positionals.size());
        std::transform(positionals.begin(), positionals.end(), positional_names.begin(), [this](const Option *opt) {
            return make_option_usage(opt);
        });

        out << " " << detail::join(positional_names, " ");
    }

    // Add a marker if subcommands are expected or optional
    if(!app->get_subcommands(
               [](const CLI::App *subc) { return ((!subc->get_disabled()) && (!subc->get_name().empty())); })
            .empty()) {
        out << ' ' << (app->get_require_subcommand_min() == 0 ? "[" : "")
            << get_label(app->get_require_subcommand_max() < 2 || app->get_require_subcommand_min() > 1 ? "SUBCOMMAND"
                                                                                                        : "SUBCOMMANDS")
            << (app->get_require_subcommand_min() == 0 ? "]" : "");
    }

    // out << "\n\n";
    out << "\n";

    return out.str();
}